

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::Resize(Mat *this,int newn,int newm)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Mat ytemp;
  Mat local_30;
  
  Mat(&local_30,this);
  if ((this->n_cols_ != newn) || (this->n_rows_ != newm)) {
    if (this->v_ != (double *)0x0) {
      operator_delete__(this->v_);
    }
    this->n_rows_ = newn;
    this->n_cols_ = newm;
    uVar5 = 0;
    if (newm * newn < 1) {
      pdVar1 = (double *)0x0;
    }
    else {
      pdVar1 = (double *)operator_new__((ulong)(uint)(newm * newn) << 3);
    }
    this->v_ = pdVar1;
    if (local_30.n_rows_ < newn) {
      newn = local_30.n_rows_;
    }
    lVar2 = (long)newm;
    if (local_30.n_cols_ < newm) {
      newm = local_30.n_cols_;
    }
    uVar3 = (ulong)(uint)newm;
    if (newm < 1) {
      uVar3 = uVar5;
    }
    uVar6 = (ulong)(uint)newn;
    if (newn < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pdVar1[uVar4] = local_30.v_[uVar4];
      }
      local_30.v_ = local_30.v_ + local_30.n_cols_;
      pdVar1 = pdVar1 + lVar2;
    }
  }
  ~Mat(&local_30);
  return;
}

Assistant:

void Mat::Resize(int newn, int newm)
{
	int i,nel;
	Mat ytemp = (*this);

	if (newn != n_cols_ || newm != n_rows_) {
		if (v_ != NULL) 
			delete[] (v_);		
		n_rows_ = newn;
		n_cols_ = newm;
		int nEl = n_rows_*n_cols_;
		v_ = n_rows_*n_cols_>0 ? new double[nEl] : NULL;		
		for (int i = 0; i < min(n_rows_,ytemp.n_rows_) ; i++)
			for (int j = 0; j < min(n_cols_,ytemp.n_cols_) ; j++)
				v_[i*n_cols_+j] = ytemp.v_[i*ytemp.n_cols_+j];
	}
}